

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

RegexpStatus * __thiscall re2::RegexpStatus::Text_abi_cxx11_(RegexpStatus *this)

{
  bool bVar1;
  char *pcVar2;
  RegexpStatusCode *in_RSI;
  RegexpStatus local_40;
  undefined1 local_19;
  RegexpStatus *this_local;
  string *s;
  
  this_local = this;
  bVar1 = StringPiece::empty((StringPiece *)(in_RSI + 2));
  if (bVar1) {
    CodeText_abi_cxx11_(this,*in_RSI);
  }
  else {
    local_19 = 0;
    std::__cxx11::string::string((string *)this);
    CodeText_abi_cxx11_(&local_40,*in_RSI);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::append((char *)this);
    pcVar2 = StringPiece::data((StringPiece *)(in_RSI + 2));
    StringPiece::size((StringPiece *)(in_RSI + 2));
    std::__cxx11::string::append((char *)this,(ulong)pcVar2);
  }
  return this;
}

Assistant:

string RegexpStatus::Text() const {
  if (error_arg_.empty())
    return CodeText(code_);
  string s;
  s.append(CodeText(code_));
  s.append(": ");
  s.append(error_arg_.data(), error_arg_.size());
  return s;
}